

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O2

pair<std::unique_ptr<pstore::json::details::matcher<callbacks_proxy<mock_json_callbacks>_>,_pstore::json::details::deleter<pstore::json::details::matcher<callbacks_proxy<mock_json_callbacks>_>_>_>,_bool>
* __thiscall
pstore::json::details::
token_matcher<callbacks_proxy<mock_json_callbacks>,_pstore::json::details::false_complete>::consume
          (pair<std::unique_ptr<pstore::json::details::matcher<callbacks_proxy<mock_json_callbacks>_>,_pstore::json::details::deleter<pstore::json::details::matcher<callbacks_proxy<mock_json_callbacks>_>_>_>,_bool>
           *__return_storage_ptr__,
          token_matcher<callbacks_proxy<mock_json_callbacks>,_pstore::json::details::false_complete>
          *this,parser<callbacks_proxy<mock_json_callbacks>_> *parser,maybe<char,_void> *ch)

{
  mock_json_callbacks *pmVar1;
  int iVar2;
  char *pcVar3;
  char *pcVar4;
  bool bVar5;
  error_code local_30;
  
  iVar2 = (this->super_matcher<callbacks_proxy<mock_json_callbacks>_>).state_;
  bVar5 = true;
  if (iVar2 == 2) {
    if (ch->valid_ == true) {
      pcVar4 = maybe<char,_void>::operator->(ch);
      pcVar3 = this->text_;
      if (*pcVar4 == *pcVar3) {
        this->text_ = pcVar3 + 1;
        if (pcVar3[1] == '\0') {
          (this->super_matcher<callbacks_proxy<mock_json_callbacks>_>).state_ = 3;
        }
        goto LAB_0012d5af;
      }
    }
    local_30._M_cat = get_error_category();
    local_30._M_value = 0xb;
    matcher<callbacks_proxy<mock_json_callbacks>_>::set_error
              (&this->super_matcher<callbacks_proxy<mock_json_callbacks>_>,parser,&local_30);
  }
  else if (iVar2 == 3) {
    bVar5 = true;
    if (ch->valid_ == true) {
      pcVar3 = maybe<char,_void>::operator->(ch);
      iVar2 = isalnum((int)*pcVar3);
      if (iVar2 != 0) {
        local_30._M_cat = get_error_category();
        local_30._M_value = 0xb;
        matcher<callbacks_proxy<mock_json_callbacks>_>::set_error
                  (&this->super_matcher<callbacks_proxy<mock_json_callbacks>_>,parser,&local_30);
        bVar5 = true;
        goto LAB_0012d5af;
      }
      bVar5 = false;
    }
    pmVar1 = (parser->callbacks_).original_;
    local_30._M_value =
         (*(pmVar1->super_json_callbacks_base)._vptr_json_callbacks_base[6])(pmVar1,0);
    matcher<callbacks_proxy<mock_json_callbacks>_>::set_error
              (&this->super_matcher<callbacks_proxy<mock_json_callbacks>_>,parser,&local_30);
    (this->super_matcher<callbacks_proxy<mock_json_callbacks>_>).state_ = 1;
  }
  else if (iVar2 == 1) {
    assert_failed("false",
                  "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/include/pstore/json/json.hpp"
                  ,0x1ad);
  }
LAB_0012d5af:
  *(undefined8 *)
   &(__return_storage_ptr__->first)._M_t.
    super___uniq_ptr_impl<pstore::json::details::matcher<callbacks_proxy<mock_json_callbacks>_>,_pstore::json::details::deleter<pstore::json::details::matcher<callbacks_proxy<mock_json_callbacks>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_pstore::json::details::matcher<callbacks_proxy<mock_json_callbacks>_>_*,_pstore::json::details::deleter<pstore::json::details::matcher<callbacks_proxy<mock_json_callbacks>_>_>_>
       = 1;
  (__return_storage_ptr__->first)._M_t.
  super___uniq_ptr_impl<pstore::json::details::matcher<callbacks_proxy<mock_json_callbacks>_>,_pstore::json::details::deleter<pstore::json::details::matcher<callbacks_proxy<mock_json_callbacks>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_pstore::json::details::matcher<callbacks_proxy<mock_json_callbacks>_>_*,_pstore::json::details::deleter<pstore::json::details::matcher<callbacks_proxy<mock_json_callbacks>_>_>_>
  .
  super__Head_base<0UL,_pstore::json::details::matcher<callbacks_proxy<mock_json_callbacks>_>_*,_false>
  ._M_head_impl = (matcher<callbacks_proxy<mock_json_callbacks>_> *)0x0;
  __return_storage_ptr__->second = bVar5;
  return __return_storage_ptr__;
}

Assistant:

std::pair<typename matcher<Callbacks>::pointer, bool>
            token_matcher<Callbacks, DoneFunction>::consume (parser<Callbacks> & parser,
                                                             maybe<char> ch) {
                bool match = true;
                switch (this->get_state ()) {
                case start_state:
                    if (!ch || *ch != *text_) {
                        this->set_error (parser, error_code::unrecognized_token);
                    } else {
                        ++text_;
                        if (*text_ == '\0') {
                            // We've run out of input text, so ensure that the next character isn't
                            // alpha-numeric.
                            this->set_state (last_state);
                        }
                    }
                    break;
                case last_state:
                    if (ch) {
                        if (std::isalnum (*ch) != 0) {
                            this->set_error (parser, error_code::unrecognized_token);
                            return {nullptr, true};
                        }
                        match = false;
                    }
                    this->set_error (parser, done_ (parser));
                    this->set_state (done_state);
                    break;
                case done_state: PSTORE_ASSERT (false); break;
                }
                return {nullptr, match};
            }